

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O0

int Col_TrieMapUnset(Col_Word map,Col_Word key)

{
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_4c;
  uint local_48;
  uint local_44;
  undefined8 local_40;
  Col_Word sibling;
  Col_Word parent;
  Col_Word grandParent;
  Col_Word node;
  Col_Word key_local;
  Col_Word map_local;
  
  if (map == 0) {
    local_44 = 0;
  }
  else {
    if ((map & 0xf) == 0) {
      if ((*(byte *)map & 2) == 0) {
        local_4c = 0xffffffff;
      }
      else {
        local_4c = *(byte *)map & 0xfffffffe;
      }
      local_48 = local_4c;
    }
    else {
      local_48 = immediateWordTypes[map & 0x1f];
    }
    local_44 = local_48;
  }
  node = key;
  key_local = map;
  if (local_44 == 0xffffffff) {
    grandParent = TrieMapFindNode(map,key,0,(int *)0x0,&parent,&sibling,(Col_Word *)0x0,
                                  (Col_Word *)0x0,(size_t *)0x0,(size_t *)0x0);
  }
  else if (local_44 == 0x42) {
    grandParent = StringTrieMapFindNode
                            (map,key,0,(int *)0x0,&parent,&sibling,(Col_Word *)0x0,(Col_Word *)0x0,
                             (size_t *)0x0,(Col_Char *)0x0);
  }
  if (grandParent == 0) {
    map_local._4_4_ = 0;
  }
  else {
    *(long *)(key_local + 0x10) = *(long *)(key_local + 0x10) + -1;
    if (parent == 0) {
      *(undefined8 *)(key_local + 0x18) = 0;
      map_local._4_4_ = 1;
    }
    else {
      if (grandParent == *(Col_Word *)(sibling + 0x18)) {
        local_40 = *(undefined8 *)(sibling + 0x10);
      }
      else {
        local_40 = *(undefined8 *)(sibling + 0x18);
      }
      if (parent == key_local) {
        *(undefined8 *)(key_local + 0x18) = local_40;
      }
      else {
        if (parent == 0) {
          local_54 = 0;
        }
        else {
          if ((parent & 0xf) == 0) {
            if ((*(byte *)parent & 2) == 0) {
              local_5c = 0xffffffff;
            }
            else {
              local_5c = *(byte *)parent & 0xfffffffe;
            }
            local_58 = local_5c;
          }
          else {
            local_58 = immediateWordTypes[parent & 0x1f];
          }
          local_54 = local_58;
        }
        if (local_54 != 0x56) {
          parent = ConvertStringNodeToMutable(parent,key_local,node);
        }
        if (*(Col_Word *)(parent + 0x10) == sibling) {
          *(undefined8 *)(parent + 0x10) = local_40;
        }
        else {
          *(undefined8 *)(parent + 0x18) = local_40;
        }
      }
      map_local._4_4_ = 1;
    }
  }
  return map_local._4_4_;
}

Assistant:

int
Col_TrieMapUnset(
    Col_Word map,   /*!< Trie map to remove entry from. */
    Col_Word key)   /*!< Entry key. Can be any word type, including string,
                         however it must match the actual type used by the
                         map. */
{
    Col_Word node, grandParent, parent, sibling;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDTRIEMAP,map} */
    TYPECHECK_WORDTRIEMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRTRIEMAP:
        node = StringTrieMapFindNode(map, key, 0, NULL, &grandParent, &parent,
                NULL, NULL, NULL, NULL);
        break;

    case WORD_TYPE_CUSTOM:
        node = TrieMapFindNode(map, key, 0, NULL, &grandParent, &parent, NULL,
                NULL, NULL, NULL);
        break;

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    if (!node) {
        /*
         * Not found.
         */

        return 0;
    }

    WORD_TRIEMAP_SIZE(map)--;

    if (!grandParent) {
        /*
         * Last entry.
         */

        ASSERT(parent == map);
        ASSERT(WORD_TRIEMAP_ROOT(map) == node);
        ASSERT(WORD_TRIEMAP_SIZE(map) == 0);
        WORD_TRIEMAP_ROOT(map) = WORD_NIL;

        return 1;
    }

    /*
     * Replace parent by sibling.
     */

    ASSERT(WORD_TYPE(parent) == WORD_TYPE_STRTRIENODE || WORD_TYPE(parent) == WORD_TYPE_MSTRTRIENODE);
    if (node == WORD_TRIENODE_RIGHT(parent)) {
        sibling = WORD_TRIENODE_LEFT(parent);
    } else {
        sibling = WORD_TRIENODE_RIGHT(parent);
    }
    if (grandParent == map) {
        /*
         * Parent was root.
         */

        ASSERT(WORD_TRIEMAP_ROOT(map) == parent);
        WORD_TRIEMAP_ROOT(map) = sibling;
    } else {
        if (WORD_TYPE(grandParent) != WORD_TYPE_MSTRTRIENODE) {
            /*
             * Grandparent is immutable, convert first.
             */

            ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_STRTRIENODE);
            grandParent = ConvertStringNodeToMutable(grandParent, map, key);
        }
        ASSERT(WORD_TYPE(grandParent) == WORD_TYPE_MSTRTRIENODE);
        if (WORD_TRIENODE_LEFT(grandParent) == parent) {
            WORD_TRIENODE_LEFT(grandParent) = sibling;
        } else {
            WORD_TRIENODE_RIGHT(grandParent) = sibling;
        }
    }

    return 1;
}